

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiprobe.cpp
# Opt level: O0

int main(void)

{
  mapped_type *pmVar1;
  ulong uVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  RtMidiIn *this;
  RtMidiOut *this_00;
  RtMidiError *error;
  string portName_1;
  Api local_110;
  uint i_2;
  string local_108 [32];
  string local_e8 [8];
  string portName;
  uint i_1;
  uint nPorts;
  string local_b8 [32];
  RtMidiOut *local_98;
  RtMidiOut *midiout;
  RtMidiIn *midiin;
  undefined1 local_80 [4];
  uint i;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  key_type local_60 [7];
  key_type local_44;
  undefined1 local_40 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  apiMap;
  
  apiMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_40);
  local_44 = 1;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_44);
  std::__cxx11::string::operator=((string *)pmVar1,"OS-X CoreMIDI");
  local_60[2] = 4;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,local_60 + 2);
  std::__cxx11::string::operator=((string *)pmVar1,"Windows MultiMedia");
  local_60[1] = 3;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,local_60 + 1);
  std::__cxx11::string::operator=((string *)pmVar1,"Jack Client");
  local_60[0] = 2;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,local_60);
  std::__cxx11::string::operator=((string *)pmVar1,"Linux ALSA");
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 5;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,
                        (key_type *)
                        ((long)&apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::__cxx11::string::operator=((string *)pmVar1,"RtMidi Dummy");
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_80);
  RtMidi::getCompiledApi((vector *)local_80);
  std::operator<<((ostream *)&std::cout,"\nCompiled APIs:\n");
  midiin._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)midiin._4_4_;
    sVar3 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                      ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_80);
    if (sVar3 <= uVar2) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"  ");
    pvVar5 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                       ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_80,
                        (ulong)midiin._4_4_);
    midiin._0_4_ = *pvVar5;
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_40,(key_type *)&midiin);
    poVar4 = std::operator<<(poVar4,(string *)pmVar1);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    midiin._4_4_ = midiin._4_4_ + 1;
  }
  midiout = (RtMidiOut *)0x0;
  local_98 = (RtMidiOut *)0x0;
  this = (RtMidiIn *)operator_new(0x10);
  nPorts._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"RtMidi Input Client",(allocator<char> *)((long)&nPorts + 3));
  RtMidiIn::RtMidiIn(this,UNSPECIFIED,local_b8,100);
  nPorts._2_1_ = 0;
  midiout = (RtMidiOut *)this;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&nPorts + 3));
  poVar4 = std::operator<<((ostream *)&std::cout,"\nCurrent input API: ");
  i_1 = RtMidiIn::getCurrentApi((RtMidiIn *)midiout);
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,(key_type *)&i_1);
  poVar4 = std::operator<<(poVar4,(string *)pmVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  portName.field_2._12_4_ = (**(code **)(*(long *)midiout + 0x10))();
  poVar4 = std::operator<<((ostream *)&std::cout,"\nThere are ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,portName.field_2._12_4_);
  std::operator<<(poVar4," MIDI input sources available.\n");
  for (portName.field_2._8_4_ = 0; (uint)portName.field_2._8_4_ < (uint)portName.field_2._12_4_;
      portName.field_2._8_4_ = portName.field_2._8_4_ + 1) {
    (**(code **)(*(long *)midiout + 0x18))(local_e8,midiout,portName.field_2._8_4_);
    poVar4 = std::operator<<((ostream *)&std::cout,"  Input Port #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,portName.field_2._8_4_);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,local_e8);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string(local_e8);
  }
  this_00 = (RtMidiOut *)operator_new(0x10);
  i_2._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"RtMidi Output Client",(allocator<char> *)((long)&i_2 + 3));
  RtMidiOut::RtMidiOut(this_00,UNSPECIFIED,local_108);
  i_2._2_1_ = 0;
  local_98 = this_00;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
  poVar4 = std::operator<<((ostream *)&std::cout,"\nCurrent output API: ");
  local_110 = RtMidiOut::getCurrentApi(local_98);
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,(key_type *)&local_110);
  poVar4 = std::operator<<(poVar4,(string *)pmVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  portName.field_2._12_4_ = (**(code **)(*(long *)local_98 + 0x10))();
  poVar4 = std::operator<<((ostream *)&std::cout,"\nThere are ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,portName.field_2._12_4_);
  std::operator<<(poVar4," MIDI output ports available.\n");
  for (portName_1.field_2._12_4_ = 0;
      (uint)portName_1.field_2._12_4_ < (uint)portName.field_2._12_4_;
      portName_1.field_2._12_4_ = portName_1.field_2._12_4_ + 1) {
    (**(code **)(*(long *)local_98 + 0x18))(&error,local_98,portName_1.field_2._12_4_);
    poVar4 = std::operator<<((ostream *)&std::cout,"  Output Port #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,portName_1.field_2._12_4_);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)&error);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&error);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  if (midiout != (RtMidiOut *)0x0) {
    (**(code **)(*(long *)midiout + 0x40))();
  }
  if (local_98 != (RtMidiOut *)0x0) {
    (**(code **)(*(long *)local_98 + 0x40))();
  }
  apiMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_80);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_40);
  return apiMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main()
{
  // Create an api map.
  std::map<int, std::string> apiMap;
  apiMap[RtMidi::MACOSX_CORE] = "OS-X CoreMIDI";
  apiMap[RtMidi::WINDOWS_MM] = "Windows MultiMedia";
  apiMap[RtMidi::UNIX_JACK] = "Jack Client";
  apiMap[RtMidi::LINUX_ALSA] = "Linux ALSA";
  apiMap[RtMidi::RTMIDI_DUMMY] = "RtMidi Dummy";

  std::vector< RtMidi::Api > apis;
  RtMidi :: getCompiledApi( apis );

  std::cout << "\nCompiled APIs:\n";
  for ( unsigned int i=0; i<apis.size(); i++ )
    std::cout << "  " << apiMap[ apis[i] ] << std::endl;

  RtMidiIn  *midiin = 0;
  RtMidiOut *midiout = 0;

  try {

    // RtMidiIn constructor ... exception possible
    midiin = new RtMidiIn();

    std::cout << "\nCurrent input API: " << apiMap[ midiin->getCurrentApi() ] << std::endl;

    // Check inputs.
    unsigned int nPorts = midiin->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI input sources available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiin->getPortName(i);
      std::cout << "  Input Port #" << i << ": " << portName << '\n';
    }

    // RtMidiOut constructor ... exception possible
    midiout = new RtMidiOut();

    std::cout << "\nCurrent output API: " << apiMap[ midiout->getCurrentApi() ] << std::endl;

    // Check outputs.
    nPorts = midiout->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI output ports available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiout->getPortName(i);
      std::cout << "  Output Port #" << i << ": " << portName << std::endl;
    }
    std::cout << std::endl;

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

  delete midiin;
  delete midiout;

  return 0;
}